

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

void CVmObjFile::check_safety_for_open(CVmNetFile *nf,int access)

{
  int iVar1;
  CVmObject *pCVar2;
  int in_ESI;
  CVmNetFile *in_RDI;
  CVmObjFileName *ofn;
  int in_stack_ffffffffffffffdc;
  
  if (in_RDI->sfid != 0) {
    if (in_ESI == 1) {
      return;
    }
    if (in_ESI == 2) {
      return;
    }
    if (in_ESI == 3) {
      return;
    }
    if (in_ESI == 4) {
      return;
    }
    if (in_ESI == 0x1001) {
      return;
    }
    if (in_ESI == 0x1004) {
      return;
    }
  }
  if (in_RDI->is_temp != 0) {
    if (in_ESI == 1) {
      return;
    }
    if (in_ESI == 2) {
      return;
    }
    if (in_ESI == 3) {
      return;
    }
    if (in_ESI == 4) {
      return;
    }
    if (in_ESI == 0x1000) {
      return;
    }
    if (in_ESI == 0x1001) {
      return;
    }
    if (in_ESI == 0x1004) {
      return;
    }
  }
  iVar1 = CVmNetFile::is_net_file(in_RDI);
  if (iVar1 != 0) {
    return;
  }
  if (in_RDI->filespec != 0) {
    pCVar2 = vm_objp(0);
    iVar1 = (*pCVar2->_vptr_CVmObject[1])(pCVar2,CVmObjFileName::metaclass_reg_);
    if (iVar1 != 0) {
      pCVar2 = vm_objp(0);
      goto LAB_00337468;
    }
  }
  pCVar2 = (CVmObject *)0x0;
LAB_00337468:
  if ((pCVar2 != (CVmObject *)0x0) &&
     (iVar1 = CVmObjFileName::get_from_ui((CVmObjFileName *)0x337482), iVar1 != 0)) {
    in_stack_ffffffffffffffdc = CVmObjFileName::get_from_ui((CVmObjFileName *)0x337491);
    if (in_stack_ffffffffffffffdc == 1) {
      if (in_ESI == 1) {
        return;
      }
    }
    else if ((in_stack_ffffffffffffffdc == 2) && (in_ESI == 2)) {
      return;
    }
  }
  check_safety_for_open((char *)pCVar2,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void CVmObjFile::check_safety_for_open(VMG_ CVmNetFile *nf, int access)
{
    /* 
     *   Special files are inherently sandboxed, since the system determines
     *   their paths.  These are always allowed for ordinary read/write.
     */
    if (nf->sfid != 0
        && (access == VMOBJFILE_ACCESS_READ
            || access == VMOBJFILE_ACCESS_WRITE
            || access == VMOBJFILE_ACCESS_RW_KEEP
            || access == VMOBJFILE_ACCESS_RW_TRUNC
            || access == VMOBJFILE_ACCESS_GETINFO
            || access == VMOBJFILE_ACCESS_READDIR))
        return;

    /*
     *   Temporary file paths can only be obtained from the VM.  Ordinary
     *   read/write operations are allowed, as is delete. 
     */
    if (nf->is_temp
        && (access == VMOBJFILE_ACCESS_READ
            || access == VMOBJFILE_ACCESS_WRITE
            || access == VMOBJFILE_ACCESS_RW_KEEP
            || access == VMOBJFILE_ACCESS_RW_TRUNC
            || access == VMOBJFILE_ACCESS_DELETE
            || access == VMOBJFILE_ACCESS_GETINFO
            || access == VMOBJFILE_ACCESS_READDIR))
        return;

    /*
     *   Network files are subject to separate permission rules enforced by
     *   the storage server.  Local file safety settings don't apply. 
     */
    if (nf->is_net_file())
        return;
    
    /*   
     *   If the file was specifically selected by the user via a file dialog,
     *   allow access of the type proposed by the dialog, even if it's
     *   outside the sandbox.  The user has implicitly granted us permission
     *   on this individual file by manually selecting it via a UI
     *   interaction.
     */
    CVmObjFileName *ofn;
    if ((ofn = vm_objid_cast(CVmObjFileName, nf->filespec)) != 0
        && ofn->get_from_ui() != 0)
    {
        /* grant permission based on the dialog mode */
        switch (ofn->get_from_ui())
        {
        case OS_AFP_OPEN:
            /* allow reading for a file selected with an Open dialog */
            if (access == VMOBJFILE_ACCESS_READ)
                return;
            break;

        case OS_AFP_SAVE:
            /* allow writing for a file selected with a Save dialog */
            if (access == VMOBJFILE_ACCESS_WRITE)
                return;
            break;
        }

        /* 
         *   For anything we didn't override above based on the dialog mode,
         *   don't give up - the file safety permissions might still allow
         *   it.  All we've determined at this point is that the dialog
         *   selection doesn't grant extraordinary permission for the
         *   attempted access mode.
         */
    }

    /*
     *   The file wasn't specified by a type that confers any special
     *   privileges, so determine if it's accessible according to the local
     *   file name's handling under the file safety and sandbox rules.
     */
    return check_safety_for_open(vmg_ nf->lclfname, access);
}